

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# values_linear.c
# Opt level: O3

void mpt_values_linear(long points,double *target,long ld,double min,double max)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  ulong uVar5;
  double *pdVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  if (0 < points && target != (double *)0x0) {
    uVar1 = points - 1;
    *target = min;
    auVar3 = _DAT_0010b900;
    auVar2 = _DAT_0010b8f0;
    if (2 < (ulong)points) {
      dVar7 = (max - min) / (double)(long)uVar1;
      lVar4 = points + -3;
      auVar8._8_4_ = (int)lVar4;
      auVar8._0_8_ = lVar4;
      auVar8._12_4_ = (int)((ulong)lVar4 >> 0x20);
      uVar5 = 0;
      auVar8 = auVar8 ^ _DAT_0010b900;
      pdVar6 = target;
      do {
        auVar9._8_4_ = (int)uVar5;
        auVar9._0_8_ = uVar5;
        auVar9._12_4_ = (int)(uVar5 >> 0x20);
        auVar9 = (auVar9 | auVar2) ^ auVar3;
        lVar4 = uVar5 + 1;
        uVar5 = uVar5 + 2;
        if ((bool)(~(auVar9._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar9._0_4_ ||
                    auVar8._4_4_ < auVar9._4_4_) & 1)) {
          pdVar6[ld] = (double)lVar4 * dVar7 + min;
        }
        if ((auVar9._12_4_ != auVar8._12_4_ || auVar9._8_4_ <= auVar8._8_4_) &&
            auVar9._12_4_ <= auVar8._12_4_) {
          pdVar6[ld * 2] = (double)(long)uVar5 * dVar7 + min;
        }
        pdVar6 = pdVar6 + ld * 2;
      } while (uVar5 != (uVar1 & 0xfffffffffffffffe));
    }
    target[uVar1 * ld] = max;
  }
  return;
}

Assistant:

extern void mpt_values_linear(long points, double *target, long ld, double min, double max)
{
	long i, len;
	double dv;
	
	if (!target || points < 1) {
		return;
	}
	dv = (max - min) / (len = points - 1);
	
	target[0] = min;
	
	for (i = 1; i < len; i++) {
		target[i * ld] = min + i * dv;
	}
	target[len * ld] = max;
}